

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall
CLI::App::_parse(App *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CallForHelp *this_00;
  ulong uVar4;
  INIError *__return_storage_ptr__;
  reference pvVar5;
  char *pcVar6;
  reference puVar7;
  pointer pOVar8;
  ArgumentMismatch *__return_storage_ptr___00;
  RequiresError *this_01;
  reference ppOVar9;
  ExcludesError *this_02;
  size_type sVar10;
  RequiredError *pRVar11;
  ExtrasError *this_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  size_t local_2a8;
  size_t num_left_over;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  string local_280;
  string local_260;
  Option *local_240;
  Option *opt_ex;
  iterator __end3_1;
  iterator __begin3_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3_1;
  string local_218;
  string local_1f8;
  Option *local_1d8;
  Option *opt_req;
  iterator __end3;
  iterator __begin3;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_169;
  string local_168;
  reference local_148;
  Option_p *opt_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2_2;
  Option_p *opt_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2_1;
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [8];
  string ename_string;
  char *buffer;
  Option_p *opt;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  FileError *anon_var_0;
  string local_68;
  undefined1 local_48 [8];
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> values;
  bool local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool positional_only;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  this->parsed_ = true;
  local_19 = false;
  pvStack_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  while (bVar1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty(pvStack_18), ((bVar1 ^ 0xffU) & 1) != 0) {
    _parse_single(this,pvStack_18,&local_19);
  }
  if ((this->help_ptr_ != (Option *)0x0) && (sVar3 = Option::count(this->help_ptr_), sVar3 != 0)) {
    this_00 = (CallForHelp *)__cxa_allocate_exception(0x38);
    CallForHelp::CallForHelp(this_00);
    __cxa_throw(this_00,&CallForHelp::typeinfo,CallForHelp::~CallForHelp);
  }
  if (this->config_ptr_ != (Option *)0x0) {
    bVar1 = Option::operator_cast_to_bool(this->config_ptr_);
    if (bVar1) {
      Option::run_callback(this->config_ptr_);
      this->config_required_ = true;
    }
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      detail::parse_ini((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                        local_48,&this->config_name_);
      while (bVar1 = std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::
                     empty((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                            *)local_48), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = _parse_ini(this,(vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                                 *)local_48);
        if (!bVar1) {
          __return_storage_ptr__ = (INIError *)__cxa_allocate_exception(0x38);
          pvVar5 = std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::
                   back((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                        local_48);
          ::std::__cxx11::string::string((string *)&local_68,(string *)pvVar5);
          INIError::Extras(__return_storage_ptr__,&local_68);
          __cxa_throw(__return_storage_ptr__,&INIError::typeinfo,INIError::~INIError);
        }
      }
      std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::~vector
                ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)local_48
                );
    }
  }
  __end2 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(&this->options_);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                     *)&opt), bVar1) {
    puVar7 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
             ::operator*(&__end2);
    pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar7);
    sVar3 = Option::count(pOVar8);
    if (sVar3 == 0) {
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar7);
      uVar4 = ::std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        ename_string.field_2._8_8_ = 0;
        ::std::__cxx11::string::string(local_c0);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar7);
        pcVar6 = (char *)::std::__cxx11::string::c_str();
        pcVar6 = getenv(pcVar6);
        ename_string.field_2._8_8_ = pcVar6;
        if (pcVar6 != (char *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_e0,pcVar6,&local_e1);
          ::std::__cxx11::string::operator=(local_c0,local_e0);
          ::std::__cxx11::string::~string(local_e0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        }
        uVar4 = ::std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (puVar7);
          ::std::__cxx11::string::string((string *)&__range2_1,local_c0);
          Option::add_result(pOVar8,(string *)&__range2_1);
          ::std::__cxx11::string::~string((string *)&__range2_1);
        }
        ::std::__cxx11::string::~string(local_c0);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ::begin(&this->options_);
  opt_1 = (Option_p *)
          std::
          vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ::end(&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                             *)&opt_1), bVar1) {
    puVar7 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
             ::operator*(&__end2_1);
    pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar7);
    sVar3 = Option::count(pOVar8);
    if (sVar3 != 0) {
      pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar7);
      bVar1 = Option::get_callback_run(pOVar8);
      if (!bVar1) {
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar7)
        ;
        Option::run_callback(pOVar8);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ::begin(&this->options_);
  opt_2 = (Option_p *)
          std::
          vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ::end(&this->options_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                        *)&opt_2);
    if (!bVar1) {
      get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&num_left_over,this,true);
      uVar4 = this->require_subcommand_min_;
      sVar10 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                         ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&num_left_over);
      if (sVar10 < uVar4) {
        pRVar11 = (RequiredError *)__cxa_allocate_exception(0x38);
        RequiredError::Subcommand(pRVar11,this->require_subcommand_min_);
        __cxa_throw(pRVar11,&RequiredError::typeinfo,RequiredError::~RequiredError);
      }
      if (((this->allow_extras_ & 1U) == 0) && ((this->prefix_command_ & 1U) == 0)) {
        local_2a8 = remaining_size(this,false);
        if (local_2a8 != 0) {
          remaining_abi_cxx11_(&local_2c0,this,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(pvStack_18,&local_2c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2c0);
          local_2c8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (pvStack_18);
          local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ::std::
                      end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                (pvStack_18);
          ::std::
          reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (local_2c8,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_2d0);
          this_03 = (ExtrasError *)__cxa_allocate_exception(0x38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_2e8,pvStack_18);
          ExtrasError::ExtrasError(this_03,&local_2e8);
          __cxa_throw(this_03,&ExtrasError::typeinfo,ExtrasError::~ExtrasError);
        }
        local_2a8 = 0;
      }
      std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
                ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&num_left_over);
      return;
    }
    local_148 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                ::operator*(&__end2_2);
    pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_148);
    bVar1 = OptionBase<CLI::Option>::get_required(&pOVar8->super_OptionBase<CLI::Option>);
    if (bVar1) {
LAB_00117b82:
      pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_148);
      iVar2 = Option::get_expected(pOVar8);
      if (iVar2 < 0) {
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_148);
        sVar3 = Option::count(pOVar8);
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_148);
        iVar2 = Option::get_expected(pOVar8);
        if (sVar3 < (ulong)(long)-iVar2) {
          local_169 = 1;
          __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_148);
          Option::single_name_abi_cxx11_(&local_168,pOVar8);
          pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_148);
          iVar2 = Option::get_expected(pOVar8);
          ArgumentMismatch::AtLeast(__return_storage_ptr___00,&local_168,-iVar2);
          local_169 = 0;
          __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,
                      ArgumentMismatch::~ArgumentMismatch);
        }
      }
      pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_148);
      bVar1 = OptionBase<CLI::Option>::get_required(&pOVar8->super_OptionBase<CLI::Option>);
      if (bVar1) {
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_148);
        sVar3 = Option::count(pOVar8);
        if (sVar3 == 0) {
          pRVar11 = (RequiredError *)__cxa_allocate_exception(0x38);
          pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_148);
          Option::single_name_abi_cxx11_(&local_1b0,pOVar8);
          ::std::operator+(&local_190,&local_1b0," is required");
          RequiredError::RequiredError(pRVar11,&local_190);
          __cxa_throw(pRVar11,&RequiredError::typeinfo,RequiredError::~RequiredError);
        }
      }
    }
    else {
      pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_148);
      sVar3 = Option::count(pOVar8);
      if (sVar3 != 0) goto LAB_00117b82;
    }
    pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_148);
    __end3 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
             begin(&pOVar8->requires_);
    opt_req = (Option *)
              std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                        (&pOVar8->requires_);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&opt_req), bVar1) {
      ppOVar9 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3);
      local_1d8 = *ppOVar9;
      pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_148);
      sVar3 = Option::count(pOVar8);
      if ((sVar3 != 0) && (sVar3 = Option::count(local_1d8), sVar3 == 0)) {
        this_01 = (RequiresError *)__cxa_allocate_exception(0x38);
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_148);
        Option::single_name_abi_cxx11_(&local_1f8,pOVar8);
        Option::single_name_abi_cxx11_(&local_218,local_1d8);
        RequiresError::RequiresError(this_01,&local_1f8,&local_218);
        __cxa_throw(this_01,&RequiresError::typeinfo,RequiresError::~RequiresError);
      }
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3);
    }
    pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_148);
    __end3_1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
               begin(&pOVar8->excludes_);
    opt_ex = (Option *)
             std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                       (&pOVar8->excludes_);
    while (bVar1 = std::operator!=(&__end3_1,(_Self *)&opt_ex), bVar1) {
      ppOVar9 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3_1);
      local_240 = *ppOVar9;
      pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_148);
      sVar3 = Option::count(pOVar8);
      if ((sVar3 != 0) && (sVar3 = Option::count(local_240), sVar3 != 0)) {
        selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        this_02 = (ExcludesError *)__cxa_allocate_exception(0x38);
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_148);
        Option::single_name_abi_cxx11_(&local_260,pOVar8);
        Option::single_name_abi_cxx11_(&local_280,local_240);
        ExcludesError::ExcludesError(this_02,&local_260,&local_280);
        selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        __cxa_throw(this_02,&ExcludesError::typeinfo,ExcludesError::~ExcludesError);
      }
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3_1);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2_2);
  } while( true );
}

Assistant:

void _parse(std::vector<std::string> &args) {
        parsed_ = true;
        bool positional_only = false;

        while(!args.empty()) {
            _parse_single(args, positional_only);
        }

        if(help_ptr_ != nullptr && help_ptr_->count() > 0) {
            throw CallForHelp();
        }

        // Process an INI file
        if(config_ptr_ != nullptr) {
            if(*config_ptr_) {
                config_ptr_->run_callback();
                config_required_ = true;
            }
            if(!config_name_.empty()) {
                try {
                    std::vector<detail::ini_ret_t> values = detail::parse_ini(config_name_);
                    while(!values.empty()) {
                        if(!_parse_ini(values)) {
                            throw INIError::Extras(values.back().fullname);
                        }
                    }
                } catch(const FileError &) {
                    if(config_required_)
                        throw;
                }
            }
        }

        // Get envname options if not yet passed
        for(const Option_p &opt : options_) {
            if(opt->count() == 0 && !opt->envname_.empty()) {
                char *buffer = nullptr;
                std::string ename_string;

#ifdef _MSC_VER
                // Windows version
                size_t sz = 0;
                if(_dupenv_s(&buffer, &sz, opt->envname_.c_str()) == 0 && buffer != nullptr) {
                    ename_string = std::string(buffer);
                    free(buffer);
                }
#else
                // This also works on Windows, but gives a warning
                buffer = std::getenv(opt->envname_.c_str());
                if(buffer != nullptr)
                    ename_string = std::string(buffer);
#endif

                if(!ename_string.empty()) {
                    opt->add_result(ename_string);
                }
            }
        }

        // Process callbacks
        for(const Option_p &opt : options_) {
            if(opt->count() > 0 && !opt->get_callback_run()) {
                opt->run_callback();
            }
        }

        // Verify required options
        for(const Option_p &opt : options_) {
            // Required or partially filled
            if(opt->get_required() || opt->count() != 0) {
                // Make sure enough -N arguments parsed (+N is already handled in parsing function)
                if(opt->get_expected() < 0 && opt->count() < static_cast<size_t>(-opt->get_expected()))
                    throw ArgumentMismatch::AtLeast(opt->single_name(), -opt->get_expected());

                // Required but empty
                if(opt->get_required() && opt->count() == 0)
                    throw RequiredError(opt->single_name() + " is required");
            }
            // Requires
            for(const Option *opt_req : opt->requires_)
                if(opt->count() > 0 && opt_req->count() == 0)
                    throw RequiresError(opt->single_name(), opt_req->single_name());
            // Excludes
            for(const Option *opt_ex : opt->excludes_)
                if(opt->count() > 0 && opt_ex->count() != 0)
                    throw ExcludesError(opt->single_name(), opt_ex->single_name());
        }

        auto selected_subcommands = get_subcommands();
        if(require_subcommand_min_ > selected_subcommands.size())
            throw RequiredError::Subcommand(require_subcommand_min_);

        // Convert missing (pairs) to extras (string only)
        if(!(allow_extras_ || prefix_command_)) {
            size_t num_left_over = remaining_size();
            if(num_left_over > 0) {
                args = remaining(false);
                std::reverse(std::begin(args), std::end(args));
                throw ExtrasError(args);
            }
        }
    }